

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

void __thiscall
gl3cts::TransformFeedback::CaptureVertexSeparate::createTransformFeedbackBuffer
          (CaptureVertexSeparate *this)

{
  createTransformFeedbackBuffer
            ((CaptureVertexSeparate *)
             ((long)&this->_vptr_CaptureVertexSeparate + (long)this->_vptr_CaptureVertexSeparate[-9]
             ));
  return;
}

Assistant:

void gl3cts::TransformFeedback::CaptureVertexSeparate::createTransformFeedbackBuffer(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_buffers = new glw::GLuint[m_max_transform_feedback_components];

	if (DE_NULL == m_buffers)
	{
		throw 0;
	}

	gl.genBuffers(m_max_transform_feedback_separate_attribs, m_buffers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

	m_buffer_size = static_cast<glw::GLuint>(m_max_vertices_drawn * 4 /* vec4 */ * sizeof(glw::GLfloat));

	for (glw::GLint i = 0; i < m_max_transform_feedback_separate_attribs; ++i)
	{
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_buffers[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, m_buffer_size, NULL, GL_DYNAMIC_READ);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");
	}
}